

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reduce.cpp
# Opt level: O1

void move_only_transform_reduce<tf::StaticPartitioner<tf::DefaultClosureWrapper>>(uint W)

{
  int *piVar1;
  undefined8 *puVar2;
  Result *pRVar3;
  code *pcVar4;
  double dVar5;
  pointer puVar6;
  pointer puVar7;
  char extraout_AL;
  bool bVar8;
  char extraout_AL_00;
  char extraout_AL_01;
  char extraout_AL_02;
  char extraout_AL_03;
  int iVar9;
  long lVar10;
  void *pvVar11;
  char *pcVar12;
  long lVar13;
  long lVar14;
  pointer *__ptr;
  default_delete<tf::Node> *pdVar15;
  Executor *pEVar16;
  pointer *__ptr_1;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 uVar17;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 uVar18;
  in_place_type_t<tf::Node::Runtime> local_329;
  unsigned_long local_328;
  undefined1 local_31c [8];
  undefined1 local_314 [4];
  Result local_310;
  Expression_lhs<const_int_&> local_2f0;
  ResultBuilder DOCTEST_RB;
  size_t N;
  shared_ptr<tf::WorkerInterface> local_248;
  Taskflow taskflow;
  Executor executor;
  
  local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,(ulong)W,&local_248);
  if (local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  taskflow.super_FlowBuilder._graph = &taskflow._graph;
  taskflow._mutex.super___mutex_base._M_mutex.__align = 0;
  taskflow._mutex.super___mutex_base._M_mutex._8_8_ = 0;
  taskflow._mutex.super___mutex_base._M_mutex._16_8_ = 0;
  taskflow._mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  taskflow._mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  taskflow._name._M_dataplus._M_p = (pointer)&taskflow._name.field_2;
  taskflow._name._M_string_length = 0;
  taskflow._name.field_2._M_local_buf[0] = '\0';
  taskflow._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  taskflow._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  taskflow._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
  _M_initialize_map((_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
                     *)&taskflow._topologies,0);
  taskflow._satellite.super__Optional_base<std::_List_iterator<tf::Taskflow>,_true,_true>._M_payload
  .super__Optional_payload_base<std::_List_iterator<tf::Taskflow>_>._M_engaged = false;
  lVar14 = 0;
  while( true ) {
    puVar7 = taskflow._graph.
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             .
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar6 = taskflow._graph.
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             .
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar10 = (long)*(int *)((long)&DAT_0016cca8 + lVar14);
    pdVar15 = (default_delete<tf::Node> *)
              taskflow._graph.
              super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
              .
              super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (taskflow._graph.
        super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        .
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        taskflow._graph.
        super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        .
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      do {
        if (*(Node **)pdVar15 != (Node *)0x0) {
          std::default_delete<tf::Node>::operator()(pdVar15,*(Node **)pdVar15);
        }
        *(undefined8 *)pdVar15 = 0;
        pdVar15 = pdVar15 + 8;
      } while (pdVar15 != (default_delete<tf::Node> *)puVar7);
      taskflow._graph.
      super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      .
      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = puVar6;
    }
    N = 100000;
    pvVar11 = operator_new(400000);
    pcVar12 = (char *)((long)pvVar11 + 400000);
    lVar13 = 0;
    pRVar3 = (Result *)(local_314 + 4);
    do {
      puVar2 = (undefined8 *)((long)pvVar11 + lVar13 * 4);
      *puVar2 = 0xfffffb2efffffb2e;
      puVar2[1] = 0xfffffb2efffffb2e;
      lVar13 = lVar13 + 4;
    } while (lVar13 != 100000);
    lVar13 = 0;
    do {
      puVar2 = (undefined8 *)((long)pvVar11 + lVar13 * 4);
      *puVar2 = 0x100000001;
      puVar2[1] = 0x100000001;
      lVar13 = lVar13 + 4;
    } while (lVar13 != 100000);
    local_314 = (undefined1  [4])0x64;
    DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)local_314;
    local_310._0_8_ = 0;
    local_2f0.lhs = (int *)0x0;
    local_328 = local_328 & 0xffffffff00000000;
    DOCTEST_RB.super_AssertData._8_8_ = pvVar11;
    DOCTEST_RB.super_AssertData.m_file = pcVar12;
    DOCTEST_RB.super_AssertData._24_8_ = lVar10;
    tf::Graph::
    _emplace_back<int_const&,int_const&,tf::DefaultTaskParams,decltype(nullptr),decltype(nullptr),int,std::in_place_type_t<tf::Node::Runtime>,tf::make_transform_reduce_task<__gnu_cxx::__normal_iterator<MoveOnly1*,std::vector<MoveOnly1,std::allocator<MoveOnly1>>>,__gnu_cxx::__normal_iterator<MoveOnly1*,std::vector<MoveOnly1,std::allocator<MoveOnly1>>>,MoveOnly2,move_only_transform_reduce<tf::StaticPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda(MoveOnly2,MoveOnly2)_1_,move_only_transform_reduce<tf::StaticPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda(MoveOnly1_const&)_1_,tf::StaticPartitioner<tf::DefaultClosureWrapper>>(__gnu_cxx::__normal_iterator<MoveOnly1*,std::vector<MoveOnly1,std::allocator<MoveOnly1>>>,__gnu_cxx::__normal_iterator<MoveOnly1*,std::vector<MoveOnly1,std::allocator<MoveOnly1>>>,MoveOnly2&,move_only_transform_reduce<tf::StaticPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda(MoveOnly2,MoveOnly2)_1_,move_only_transform_reduce<tf::StaticPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda(MoveOnly1_const&)_1_,tf::StaticPartitioner<tf::DefaultClosureWrapper>)::_lambda(tf::Runtime&)_1_>
              (taskflow.super_FlowBuilder._graph,&tf::NSTATE::NONE,&tf::ESTATE::NONE,
               (DefaultTaskParams *)local_31c,(void **)pRVar3,&local_2f0.lhs,(int *)&local_328,
               &local_329,(anon_class_48_6_3af2c317_conflict *)&DOCTEST_RB);
    local_310._0_8_ = 1;
    pEVar16 = &executor;
    tf::Executor::
    run_until<tf::Executor::run_n<tf::Executor::run(tf::Taskflow&)::_lambda()_1_>(tf::Taskflow&,unsigned_long,tf::Executor::run(tf::Taskflow&)::_lambda()_1_&&)::_lambda()_1_,tf::Executor::run(tf::Taskflow&)::_lambda()_1_>
              ((Future<void> *)&DOCTEST_RB,pEVar16,&taskflow,(anon_class_8_1_69701ed9 *)pRVar3,
               (anon_class_1_0_00000001 *)&local_2f0);
    if (DOCTEST_RB.super_AssertData.m_test_case == (TestCaseData *)0x0) break;
    std::__future_base::_State_baseV2::wait
              ((_State_baseV2 *)DOCTEST_RB.super_AssertData.m_test_case,pEVar16);
    if (DOCTEST_RB.super_AssertData._24_8_ != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar1 = (int *)(DOCTEST_RB.super_AssertData._24_8_ + 0xc);
        iVar9 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
      }
      else {
        iVar9 = *(int *)(DOCTEST_RB.super_AssertData._24_8_ + 0xc);
        *(int *)(DOCTEST_RB.super_AssertData._24_8_ + 0xc) = iVar9 + -1;
      }
      if (iVar9 == 1) {
        (**(code **)(*(long *)DOCTEST_RB.super_AssertData._24_8_ + 0x18))();
      }
    }
    if (DOCTEST_RB.super_AssertData._8_8_ != 0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)DOCTEST_RB.super_AssertData._8_8_);
    }
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_reduce.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x334;
    DOCTEST_RB.super_AssertData.m_expr = "res.b == N + 100";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    local_2f0.lhs = (int *)local_314;
    local_2f0.m_at = DT_REQUIRE;
    local_328 = 0x18704;
    doctest::detail::Expression_lhs<int_const&>::operator==
              (pRVar3,(Expression_lhs<int_const&> *)&local_2f0,&local_328);
    doctest::String::operator=(&DOCTEST_RB.super_AssertData.m_decomp,&local_310.m_decomp);
    DOCTEST_RB.super_AssertData._40_2_ =
         CONCAT11(DOCTEST_RB.super_AssertData.m_threw,local_310.m_passed) ^ 1;
    uVar17 = extraout_XMM0_Da;
    uVar18 = extraout_XMM0_Db;
    if ((local_310.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_310.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_310.m_decomp.field_0.data.ptr);
      uVar17 = extraout_XMM0_Da_00;
      uVar18 = extraout_XMM0_Db_00;
    }
    dVar5 = doctest::detail::ResultBuilder::log(&DOCTEST_RB,(double)CONCAT44(uVar18,uVar17));
    if (extraout_AL != '\0') {
      pcVar4 = (code *)swi(3);
      (*pcVar4)(SUB84(dVar5,0));
      return;
    }
    if (DOCTEST_RB.super_AssertData.m_failed == true) {
      bVar8 = doctest::detail::checkIfShouldThrow(DOCTEST_RB.super_AssertData.m_at);
      if (bVar8) goto LAB_0014605c;
    }
    if ((DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                         DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                                         DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]));
    }
    if ((DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                         DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                                         DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]));
    }
    puVar7 = taskflow._graph.
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             .
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar6 = taskflow._graph.
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             .
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar15 = (default_delete<tf::Node> *)
              taskflow._graph.
              super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
              .
              super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (taskflow._graph.
        super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        .
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        taskflow._graph.
        super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        .
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      do {
        if (*(Node **)pdVar15 != (Node *)0x0) {
          std::default_delete<tf::Node>::operator()(pdVar15,*(Node **)pdVar15);
        }
        *(undefined8 *)pdVar15 = 0;
        pdVar15 = pdVar15 + 8;
      } while (pdVar15 != (default_delete<tf::Node> *)puVar7);
      taskflow._graph.
      super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      .
      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = puVar6;
    }
    local_314 = (undefined1  [4])0x0;
    DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)local_314;
    local_310._0_8_ = 0;
    local_2f0.lhs = (int *)0x0;
    local_328 = local_328 & 0xffffffff00000000;
    DOCTEST_RB.super_AssertData._8_8_ = pvVar11;
    DOCTEST_RB.super_AssertData.m_file = pcVar12;
    DOCTEST_RB.super_AssertData._24_8_ = lVar10;
    tf::Graph::
    _emplace_back<int_const&,int_const&,tf::DefaultTaskParams,decltype(nullptr),decltype(nullptr),int,std::in_place_type_t<tf::Node::Runtime>,tf::make_transform_reduce_task<__gnu_cxx::__normal_iterator<MoveOnly1*,std::vector<MoveOnly1,std::allocator<MoveOnly1>>>,__gnu_cxx::__normal_iterator<MoveOnly1*,std::vector<MoveOnly1,std::allocator<MoveOnly1>>>,MoveOnly2,move_only_transform_reduce<tf::StaticPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda(MoveOnly2&&,MoveOnly2&&)_1_,move_only_transform_reduce<tf::StaticPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda(MoveOnly1&)_1_,tf::StaticPartitioner<tf::DefaultClosureWrapper>>(__gnu_cxx::__normal_iterator<MoveOnly1*,std::vector<MoveOnly1,std::allocator<MoveOnly1>>>,__gnu_cxx::__normal_iterator<MoveOnly1*,std::vector<MoveOnly1,std::allocator<MoveOnly1>>>,MoveOnly2&,move_only_transform_reduce<tf::StaticPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda(MoveOnly2&&,MoveOnly2&&)_1_,move_only_transform_reduce<tf::StaticPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda(MoveOnly1&)_1_,tf::StaticPartitioner<tf::DefaultClosureWrapper>)::_lambda(tf::Runtime&)_1_>
              (taskflow.super_FlowBuilder._graph,&tf::NSTATE::NONE,&tf::ESTATE::NONE,
               (DefaultTaskParams *)local_31c,(void **)(local_314 + 4),&local_2f0.lhs,
               (int *)&local_328,&local_329,(anon_class_48_6_3af2c317_conflict *)&DOCTEST_RB);
    local_310._0_8_ = 1;
    pEVar16 = &executor;
    tf::Executor::
    run_until<tf::Executor::run_n<tf::Executor::run(tf::Taskflow&)::_lambda()_1_>(tf::Taskflow&,unsigned_long,tf::Executor::run(tf::Taskflow&)::_lambda()_1_&&)::_lambda()_1_,tf::Executor::run(tf::Taskflow&)::_lambda()_1_>
              ((Future<void> *)&DOCTEST_RB,pEVar16,&taskflow,
               (anon_class_8_1_69701ed9 *)(local_314 + 4),(anon_class_1_0_00000001 *)&local_2f0);
    if (DOCTEST_RB.super_AssertData.m_test_case == (TestCaseData *)0x0) goto LAB_0014603e;
    std::__future_base::_State_baseV2::wait
              ((_State_baseV2 *)DOCTEST_RB.super_AssertData.m_test_case,pEVar16);
    if (DOCTEST_RB.super_AssertData._24_8_ != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar1 = (int *)(DOCTEST_RB.super_AssertData._24_8_ + 0xc);
        iVar9 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
      }
      else {
        iVar9 = *(int *)(DOCTEST_RB.super_AssertData._24_8_ + 0xc);
        *(int *)(DOCTEST_RB.super_AssertData._24_8_ + 0xc) = iVar9 + -1;
      }
      if (iVar9 == 1) {
        (**(code **)(*(long *)DOCTEST_RB.super_AssertData._24_8_ + 0x18))();
      }
    }
    if (DOCTEST_RB.super_AssertData._8_8_ != 0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)DOCTEST_RB.super_AssertData._8_8_);
    }
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_reduce.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x34a;
    DOCTEST_RB.super_AssertData.m_expr = "res.b == N";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    local_2f0.lhs = (int *)local_314;
    local_2f0.m_at = DT_REQUIRE;
    doctest::detail::Expression_lhs<const_int_&>::operator==<unsigned_long,_nullptr>
              ((Result *)(local_314 + 4),&local_2f0,&N);
    doctest::String::operator=(&DOCTEST_RB.super_AssertData.m_decomp,&local_310.m_decomp);
    DOCTEST_RB.super_AssertData._40_2_ =
         CONCAT11(DOCTEST_RB.super_AssertData.m_threw,local_310.m_passed) ^ 1;
    uVar17 = extraout_XMM0_Da_01;
    uVar18 = extraout_XMM0_Db_01;
    if ((local_310.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_310.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_310.m_decomp.field_0.data.ptr);
      uVar17 = extraout_XMM0_Da_02;
      uVar18 = extraout_XMM0_Db_02;
    }
    dVar5 = doctest::detail::ResultBuilder::log(&DOCTEST_RB,(double)CONCAT44(uVar18,uVar17));
    if (extraout_AL_00 != '\0') {
      pcVar4 = (code *)swi(3);
      (*pcVar4)(SUB84(dVar5,0));
      return;
    }
    if (DOCTEST_RB.super_AssertData.m_failed == true) {
      bVar8 = doctest::detail::checkIfShouldThrow(DOCTEST_RB.super_AssertData.m_at);
      if (bVar8) {
        doctest::detail::throwException();
      }
    }
    if ((DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                         DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                                         DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]));
    }
    if ((DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                         DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                                         DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]));
    }
    lVar13 = 0;
    do {
      local_2f0.lhs = (int *)((long)pvVar11 + lVar13);
      DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
      DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
      DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0] = '\0';
      DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
      DOCTEST_RB.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_reduce.cpp"
      ;
      DOCTEST_RB.super_AssertData.m_line = 0x34d;
      DOCTEST_RB.super_AssertData.m_expr = "i.a == -7";
      DOCTEST_RB.super_AssertData.m_failed = true;
      DOCTEST_RB.super_AssertData.m_threw = false;
      DOCTEST_RB.super_AssertData.m_threw_as = false;
      DOCTEST_RB.super_AssertData.m_exception_type = "";
      DOCTEST_RB.super_AssertData.m_exception_string = "";
      local_2f0.m_at = DT_REQUIRE;
      local_328 = CONCAT44(local_328._4_4_,0xfffffff9);
      doctest::detail::Expression_lhs<int_const&>::operator==
                ((Result *)(local_314 + 4),(Expression_lhs<int_const&> *)&local_2f0,
                 (int *)&local_328);
      doctest::String::operator=(&DOCTEST_RB.super_AssertData.m_decomp,&local_310.m_decomp);
      DOCTEST_RB.super_AssertData._40_2_ =
           CONCAT11(DOCTEST_RB.super_AssertData.m_threw,local_310.m_passed) ^ 1;
      uVar17 = extraout_XMM0_Da_03;
      uVar18 = extraout_XMM0_Db_03;
      if ((local_310.m_decomp.field_0.buf[0x17] < '\0') &&
         (local_310.m_decomp.field_0.data.ptr != (char *)0x0)) {
        operator_delete__(local_310.m_decomp.field_0.data.ptr);
        uVar17 = extraout_XMM0_Da_04;
        uVar18 = extraout_XMM0_Db_04;
      }
      dVar5 = doctest::detail::ResultBuilder::log(&DOCTEST_RB,(double)CONCAT44(uVar18,uVar17));
      if (extraout_AL_01 != '\0') {
        pcVar4 = (code *)swi(3);
        (*pcVar4)(SUB84(dVar5,0));
        return;
      }
      if (DOCTEST_RB.super_AssertData.m_failed == true) {
        bVar8 = doctest::detail::checkIfShouldThrow(DOCTEST_RB.super_AssertData.m_at);
        if (bVar8) {
          doctest::detail::throwException();
        }
      }
      if ((DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                           DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                                           DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]));
      }
      if ((DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                           DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0))
      {
        operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                                           DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]));
      }
      puVar7 = taskflow._graph.
               super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
               .
               super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      puVar6 = taskflow._graph.
               super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
               .
               super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar13 = lVar13 + 4;
    } while (lVar13 != 400000);
    pdVar15 = (default_delete<tf::Node> *)
              taskflow._graph.
              super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
              .
              super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (taskflow._graph.
        super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        .
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        taskflow._graph.
        super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        .
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      do {
        if (*(Node **)pdVar15 != (Node *)0x0) {
          std::default_delete<tf::Node>::operator()(pdVar15,*(Node **)pdVar15);
        }
        *(undefined8 *)pdVar15 = 0;
        pdVar15 = pdVar15 + 8;
      } while (pdVar15 != (default_delete<tf::Node> *)puVar7);
      taskflow._graph.
      super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      .
      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = puVar6;
    }
    local_31c._0_4_ = 0;
    local_310._0_8_ = 0;
    local_2f0.lhs = (int *)0x0;
    local_328 = local_328 & 0xffffffff00000000;
    DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)local_31c;
    DOCTEST_RB.super_AssertData._8_8_ = pvVar11;
    DOCTEST_RB.super_AssertData.m_file = pcVar12;
    DOCTEST_RB.super_AssertData._24_8_ = lVar10;
    tf::Graph::
    _emplace_back<int_const&,int_const&,tf::DefaultTaskParams,decltype(nullptr),decltype(nullptr),int,std::in_place_type_t<tf::Node::Runtime>,tf::make_reduce_task<__gnu_cxx::__normal_iterator<MoveOnly1*,std::vector<MoveOnly1,std::allocator<MoveOnly1>>>,__gnu_cxx::__normal_iterator<MoveOnly1*,std::vector<MoveOnly1,std::allocator<MoveOnly1>>>,MoveOnly1,move_only_transform_reduce<tf::StaticPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda(MoveOnly1&,MoveOnly1&)_1_,tf::StaticPartitioner<tf::DefaultClosureWrapper>>(__gnu_cxx::__normal_iterator<MoveOnly1*,std::vector<MoveOnly1,std::allocator<MoveOnly1>>>,__gnu_cxx::__normal_iterator<MoveOnly1*,std::vector<MoveOnly1,std::allocator<MoveOnly1>>>,MoveOnly1&,move_only_transform_reduce<tf::StaticPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda(MoveOnly1&,MoveOnly1&)_1_,tf::StaticPartitioner<tf::DefaultClosureWrapper>)::_lambda(tf::Runtime&)_1_>
              (taskflow.super_FlowBuilder._graph,&tf::NSTATE::NONE,&tf::ESTATE::NONE,
               (DefaultTaskParams *)&local_329,(void **)(local_314 + 4),&local_2f0.lhs,
               (int *)&local_328,(in_place_type_t<tf::Node::Runtime> *)(local_31c + 7),
               (anon_class_48_5_c1f71ee7_conflict *)&DOCTEST_RB);
    local_310._0_8_ = 1;
    pEVar16 = &executor;
    tf::Executor::
    run_until<tf::Executor::run_n<tf::Executor::run(tf::Taskflow&)::_lambda()_1_>(tf::Taskflow&,unsigned_long,tf::Executor::run(tf::Taskflow&)::_lambda()_1_&&)::_lambda()_1_,tf::Executor::run(tf::Taskflow&)::_lambda()_1_>
              ((Future<void> *)&DOCTEST_RB,pEVar16,&taskflow,
               (anon_class_8_1_69701ed9 *)(local_314 + 4),(anon_class_1_0_00000001 *)&local_2f0);
    if (DOCTEST_RB.super_AssertData.m_test_case == (TestCaseData *)0x0) goto LAB_00146048;
    std::__future_base::_State_baseV2::wait
              ((_State_baseV2 *)DOCTEST_RB.super_AssertData.m_test_case,pEVar16);
    if (DOCTEST_RB.super_AssertData._24_8_ != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar1 = (int *)(DOCTEST_RB.super_AssertData._24_8_ + 0xc);
        iVar9 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
      }
      else {
        iVar9 = *(int *)(DOCTEST_RB.super_AssertData._24_8_ + 0xc);
        *(int *)(DOCTEST_RB.super_AssertData._24_8_ + 0xc) = iVar9 + -1;
      }
      if (iVar9 == 1) {
        (**(code **)(*(long *)DOCTEST_RB.super_AssertData._24_8_ + 0x18))();
      }
    }
    if (DOCTEST_RB.super_AssertData._8_8_ != 0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)DOCTEST_RB.super_AssertData._8_8_);
    }
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_reduce.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x35f;
    DOCTEST_RB.super_AssertData.m_expr = "red.a == -7*N";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    local_2f0.m_at = DT_REQUIRE;
    local_328 = 0xfffffffffff551a0;
    local_2f0.lhs = (int *)local_31c;
    doctest::detail::Expression_lhs<int_const&>::operator==
              ((Result *)(local_314 + 4),(Expression_lhs<int_const&> *)&local_2f0,&local_328);
    doctest::String::operator=(&DOCTEST_RB.super_AssertData.m_decomp,&local_310.m_decomp);
    DOCTEST_RB.super_AssertData._40_2_ =
         CONCAT11(DOCTEST_RB.super_AssertData.m_threw,local_310.m_passed) ^ 1;
    uVar17 = extraout_XMM0_Da_05;
    uVar18 = extraout_XMM0_Db_05;
    if ((local_310.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_310.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_310.m_decomp.field_0.data.ptr);
      uVar17 = extraout_XMM0_Da_06;
      uVar18 = extraout_XMM0_Db_06;
    }
    dVar5 = doctest::detail::ResultBuilder::log(&DOCTEST_RB,(double)CONCAT44(uVar18,uVar17));
    if (extraout_AL_02 != '\0') {
      pcVar4 = (code *)swi(3);
      (*pcVar4)(SUB84(dVar5,0));
      return;
    }
    if (DOCTEST_RB.super_AssertData.m_failed == true) {
      bVar8 = doctest::detail::checkIfShouldThrow(DOCTEST_RB.super_AssertData.m_at);
      if (bVar8) {
        doctest::detail::throwException();
      }
    }
    if ((DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                         DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                                         DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]));
    }
    if ((DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                         DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                                         DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]));
    }
    puVar7 = taskflow._graph.
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             .
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar6 = taskflow._graph.
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             .
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar15 = (default_delete<tf::Node> *)
              taskflow._graph.
              super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
              .
              super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (taskflow._graph.
        super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        .
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        taskflow._graph.
        super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        .
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      do {
        if (*(Node **)pdVar15 != (Node *)0x0) {
          std::default_delete<tf::Node>::operator()(pdVar15,*(Node **)pdVar15);
        }
        *(undefined8 *)pdVar15 = 0;
        pdVar15 = pdVar15 + 8;
      } while (pdVar15 != (default_delete<tf::Node> *)puVar7);
      taskflow._graph.
      super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      .
      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = puVar6;
    }
    local_31c._0_4_ = 0;
    DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)local_31c;
    local_310._0_8_ = 0;
    local_2f0.lhs = (int *)0x0;
    local_328 = local_328 & 0xffffffff00000000;
    pRVar3 = (Result *)(local_314 + 4);
    DOCTEST_RB.super_AssertData._8_8_ = pvVar11;
    DOCTEST_RB.super_AssertData.m_file = pcVar12;
    DOCTEST_RB.super_AssertData._24_8_ = lVar10;
    tf::Graph::
    _emplace_back<int_const&,int_const&,tf::DefaultTaskParams,decltype(nullptr),decltype(nullptr),int,std::in_place_type_t<tf::Node::Runtime>,tf::make_reduce_task<__gnu_cxx::__normal_iterator<MoveOnly1*,std::vector<MoveOnly1,std::allocator<MoveOnly1>>>,__gnu_cxx::__normal_iterator<MoveOnly1*,std::vector<MoveOnly1,std::allocator<MoveOnly1>>>,MoveOnly1,move_only_transform_reduce<tf::StaticPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda(MoveOnly1_const&,MoveOnly1_const&)_1_,tf::StaticPartitioner<tf::DefaultClosureWrapper>>(__gnu_cxx::__normal_iterator<MoveOnly1*,std::vector<MoveOnly1,std::allocator<MoveOnly1>>>,__gnu_cxx::__normal_iterator<MoveOnly1*,std::vector<MoveOnly1,std::allocator<MoveOnly1>>>,MoveOnly1&,move_only_transform_reduce<tf::StaticPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda(MoveOnly1_const&,MoveOnly1_const&)_1_,tf::StaticPartitioner<tf::DefaultClosureWrapper>)::_lambda(tf::Runtime&)_1_>
              (taskflow.super_FlowBuilder._graph,&tf::NSTATE::NONE,&tf::ESTATE::NONE,
               (DefaultTaskParams *)&local_329,(void **)pRVar3,&local_2f0.lhs,(int *)&local_328,
               (in_place_type_t<tf::Node::Runtime> *)(local_31c + 7),
               (anon_class_48_5_c1f71ee7_conflict *)&DOCTEST_RB);
    local_310._0_8_ = 1;
    pEVar16 = &executor;
    tf::Executor::
    run_until<tf::Executor::run_n<tf::Executor::run(tf::Taskflow&)::_lambda()_1_>(tf::Taskflow&,unsigned_long,tf::Executor::run(tf::Taskflow&)::_lambda()_1_&&)::_lambda()_1_,tf::Executor::run(tf::Taskflow&)::_lambda()_1_>
              ((Future<void> *)&DOCTEST_RB,pEVar16,&taskflow,(anon_class_8_1_69701ed9 *)pRVar3,
               (anon_class_1_0_00000001 *)&local_2f0);
    if (DOCTEST_RB.super_AssertData.m_test_case == (TestCaseData *)0x0) goto LAB_00146052;
    std::__future_base::_State_baseV2::wait
              ((_State_baseV2 *)DOCTEST_RB.super_AssertData.m_test_case,pEVar16);
    if (DOCTEST_RB.super_AssertData._24_8_ != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar1 = (int *)(DOCTEST_RB.super_AssertData._24_8_ + 0xc);
        iVar9 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
      }
      else {
        iVar9 = *(int *)(DOCTEST_RB.super_AssertData._24_8_ + 0xc);
        *(int *)(DOCTEST_RB.super_AssertData._24_8_ + 0xc) = iVar9 + -1;
      }
      if (iVar9 == 1) {
        (**(code **)(*(long *)DOCTEST_RB.super_AssertData._24_8_ + 0x18))();
      }
    }
    if (DOCTEST_RB.super_AssertData._8_8_ != 0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)DOCTEST_RB.super_AssertData._8_8_);
    }
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_reduce.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x36e;
    DOCTEST_RB.super_AssertData.m_expr = "red.a == -7*N";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    local_2f0.m_at = DT_REQUIRE;
    local_328 = 0xfffffffffff551a0;
    local_2f0.lhs = (int *)local_31c;
    doctest::detail::Expression_lhs<int_const&>::operator==
              (pRVar3,(Expression_lhs<int_const&> *)&local_2f0,&local_328);
    doctest::String::operator=(&DOCTEST_RB.super_AssertData.m_decomp,&local_310.m_decomp);
    DOCTEST_RB.super_AssertData._40_2_ =
         CONCAT11(DOCTEST_RB.super_AssertData.m_threw,local_310.m_passed) ^ 1;
    uVar17 = extraout_XMM0_Da_07;
    uVar18 = extraout_XMM0_Db_07;
    if ((local_310.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_310.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_310.m_decomp.field_0.data.ptr);
      uVar17 = extraout_XMM0_Da_08;
      uVar18 = extraout_XMM0_Db_08;
    }
    dVar5 = doctest::detail::ResultBuilder::log(&DOCTEST_RB,(double)CONCAT44(uVar18,uVar17));
    if (extraout_AL_03 != '\0') {
      pcVar4 = (code *)swi(3);
      (*pcVar4)(SUB84(dVar5,0));
      return;
    }
    if (DOCTEST_RB.super_AssertData.m_failed == true) {
      bVar8 = doctest::detail::checkIfShouldThrow(DOCTEST_RB.super_AssertData.m_at);
      if (bVar8) {
        doctest::detail::throwException();
      }
    }
    if ((DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                         DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                                         DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]));
    }
    if ((DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                         DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                                         DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]));
    }
    operator_delete(pvVar11,400000);
    lVar14 = lVar14 + 4;
    if (lVar14 == 0x14) {
      tf::Taskflow::~Taskflow(&taskflow);
      tf::Executor::~Executor(&executor);
      return;
    }
  }
  std::__throw_future_error(3);
LAB_0014603e:
  std::__throw_future_error(3);
LAB_00146048:
  std::__throw_future_error(3);
LAB_00146052:
  std::__throw_future_error(3);
LAB_0014605c:
  doctest::detail::throwException();
}

Assistant:

void move_only_transform_reduce(unsigned W) {

  tf::Executor executor(W);
  tf::Taskflow taskflow;

  for(size_t c : {0, 1, 3, 7, 99}) {

    P partitioner(c);
  
    taskflow.clear();

    const size_t N = 100000;
    std::vector<MoveOnly1> vec(N);

    for(auto& i : vec) i.a = 1;

    MoveOnly2 res;
    res.b = 100;

    taskflow.transform_reduce(vec.begin(), vec.end(), res,
      [](MoveOnly2 m1, MoveOnly2 m2) {
        MoveOnly2 lres;
        lres.b = m1.b + m2.b;
        return lres;
      },
      [](const MoveOnly1& m) {
        MoveOnly2 n;
        n.b = m.a;
        return n;
      },
      partitioner
    );

    executor.run(taskflow).wait();

    REQUIRE(res.b == N + 100);
    
    // change vec data
    taskflow.clear();
    res.b = 0;
    
    taskflow.transform_reduce(vec.begin(), vec.end(), res,
      [](MoveOnly2&& m1, MoveOnly2&& m2) {
        MoveOnly2 lres;
        lres.b = m1.b + m2.b;
        return lres;
      },
      [](MoveOnly1& m) {
        MoveOnly2 n;
        n.b = m.a;
        m.a = -7;
        return n;
      },
      partitioner
    );

    executor.run(taskflow).wait();
    REQUIRE(res.b == N);

    for(const auto& i : vec) {
      REQUIRE(i.a == -7);
    }

    // reduce
    taskflow.clear();
    MoveOnly1 red;
    red.a = 0;

    taskflow.reduce(vec.begin(), vec.end(), red,
      [](MoveOnly1& m1, MoveOnly1& m2){
        MoveOnly1 lres;
        lres.a = m1.a + m2.a;
        return lres;
      },
      partitioner
    );  

    executor.run(taskflow).wait();
    REQUIRE(red.a == -7*N);
    
    taskflow.clear();
    red.a = 0;

    taskflow.reduce(vec.begin(), vec.end(), red,
      [](const MoveOnly1& m1, const MoveOnly1& m2){
        MoveOnly1 lres;
        lres.a = m1.a + m2.a;
        return lres;
      },
      partitioner
    );  

    executor.run(taskflow).wait();
    REQUIRE(red.a == -7*N);
  }
}